

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O3

void __thiscall HVectorBase<double>::clear(HVectorBase<double> *this)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  long lVar4;
  value_type_conflict1 local_10;
  
  iVar1 = this->count;
  if (((long)iVar1 < 0) || ((double)this->size * 0.3 < (double)iVar1)) {
    local_10 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&this->array,(long)this->size,&local_10);
  }
  else if (iVar1 != 0) {
    piVar2 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      pdVar3[piVar2[lVar4]] = 0.0;
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  this->packFlag = false;
  this->count = 0;
  this->synthetic_tick = 0.0;
  this->next = (HVectorBase<double> *)0x0;
  return;
}

Assistant:

void HVectorBase<Real>::clear() {
  /*
   * Clear an HVector instance
   */
  // Standard HVector to clear
  HighsInt dense_clear = count < 0 || count > size * 0.3;
  if (dense_clear) {
    // Treat the array as full if there are no indices or too many
    // indices
    array.assign(size, Real{0});
  } else {
    // Zero according to the indices of (possible) nonzeros
    for (HighsInt i = 0; i < count; i++) {
      array[index[i]] = 0;
    }
  }
  this->clearScalars();
}